

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

FaceHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_face
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VHandles *_indices)

{
  ArrayKernel *this_00;
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_01;
  bool bVar1;
  value_type _heh;
  size_type sVar2;
  reference pVVar3;
  BaseHandle *this_02;
  BaseHandle *_rhs;
  mostream *pmVar4;
  pointer ppVar5;
  _Self local_b8;
  _Self local_b0;
  iterator it_heNs;
  VertexHandle vh;
  HalfedgeHandle heh;
  undefined1 local_78 [8];
  FaceHalfedgeIter fh_iter;
  __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
  local_38;
  const_iterator end;
  const_iterator it2;
  const_iterator it;
  VHandles *_indices_local;
  ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this_local;
  FaceHandle fh;
  
  FaceHandle::FaceHandle((FaceHandle *)((long)&this_local + 4),-1);
  sVar2 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::size
                    (_indices);
  if (2 < sVar2) {
    __gnu_cxx::
    __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
    ::__normal_iterator(&it2);
    __gnu_cxx::
    __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
    ::__normal_iterator(&end);
    local_38._M_current =
         (VertexHandle *)
         std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::end(_indices)
    ;
    it2 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::begin
                    (_indices);
    while (bVar1 = __gnu_cxx::operator!=(&it2,&local_38), bVar1) {
      this_00 = (ArrayKernel *)this->mesh_;
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
               ::operator*(&it2);
      bVar1 = ArrayKernel::is_valid_handle(this_00,(VertexHandle)(pVVar3->super_BaseHandle).idx_);
      if (!bVar1) {
        pmVar4 = omerr();
        std::operator<<(&pmVar4->super_ostream,"ImporterT: Face contains invalid vertex index\n");
        return (FaceHandle)(BaseHandle)this_local._4_4_;
      }
      __gnu_cxx::
      __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
      ::operator++(&it2);
    }
    it2 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::begin
                    (_indices);
    while (bVar1 = __gnu_cxx::operator!=(&it2,&local_38), bVar1) {
      end._M_current =
           (VertexHandle *)
           __gnu_cxx::
           __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
           ::operator+(&it2,1);
      while (bVar1 = __gnu_cxx::operator!=(&end,&local_38), bVar1) {
        this_02 = &__gnu_cxx::
                   __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
                   ::operator*(&it2)->super_BaseHandle;
        _rhs = &__gnu_cxx::
                __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
                ::operator*(&end)->super_BaseHandle;
        bVar1 = BaseHandle::operator==(this_02,_rhs);
        if (bVar1) {
          pmVar4 = omerr();
          std::operator<<(&pmVar4->super_ostream,"ImporterT: Face has equal vertices\n");
          std::
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          ::push_back(&this->failed_faces_,_indices);
          return (FaceHandle)(BaseHandle)this_local._4_4_;
        }
        __gnu_cxx::
        __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
        ::operator++(&end);
      }
      __gnu_cxx::
      __normal_iterator<const_OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
      ::operator++(&it2);
    }
    fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         TriConnectivity::add_face((TriConnectivity *)this->mesh_,_indices);
    this_local._4_4_ = fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
    bVar1 = BaseHandle::is_valid((BaseHandle *)((long)&this_local + 4));
    if (bVar1) {
      bVar1 = AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
              has_halfedge_normals
                        ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          *)this->mesh_);
      if (bVar1) {
        PolyConnectivity::fh_begin
                  ((FaceHalfedgeIter *)local_78,(PolyConnectivity *)this->mesh_,
                   (FaceHandle)this_local._4_4_);
        while( true ) {
          PolyConnectivity::fh_end
                    ((FaceHalfedgeIter *)&heh,(PolyConnectivity *)this->mesh_,
                     (FaceHandle)this_local._4_4_);
          bVar1 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                  ::operator!=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                                *)local_78,
                               (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                                *)&heh);
          if (!bVar1) break;
          _heh = Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                 ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                              *)local_78);
          it_heNs._M_node._0_4_ = _heh.super_BaseHandle.idx_;
          it_heNs._M_node._4_4_ =
               (int)ArrayKernel::to_vertex_handle
                              ((ArrayKernel *)this->mesh_,_heh.super_BaseHandle.idx_);
          local_b0._M_node =
               (_Base_ptr)
               std::
               map<OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>_>
               ::find(&this->halfedgeNormals_,(key_type *)((long)&it_heNs._M_node + 4));
          local_b8._M_node =
               (_Base_ptr)
               std::
               map<OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>_>
               ::end(&this->halfedgeNormals_);
          bVar1 = std::operator!=(&local_b0,&local_b8);
          if (bVar1) {
            this_01 = (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)this->mesh_;
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>
                     ::operator->(&local_b0);
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            set_normal(this_01,(HalfedgeHandle)_heh.super_BaseHandle.idx_,&ppVar5->second);
          }
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
          ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                        *)local_78);
        }
        std::
        map<OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>_>
        ::clear(&this->halfedgeNormals_);
      }
    }
    else {
      std::
      vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
      ::push_back(&this->failed_faces_,_indices);
    }
  }
  return (BaseHandle)(BaseHandle)this_local._4_4_;
}

Assistant:

virtual FaceHandle add_face(const VHandles& _indices)
  {
    FaceHandle fh;

    if (_indices.size() > 2)
    {
      VHandles::const_iterator it, it2, end(_indices.end());


      // test for valid vertex indices
      for (it=_indices.begin(); it!=end; ++it)
        if (! mesh_.is_valid_handle(*it))
        {
          omerr() << "ImporterT: Face contains invalid vertex index\n";
          return fh;
        }


      // don't allow double vertices
      for (it=_indices.begin(); it!=end; ++it)
        for (it2=it+1; it2!=end; ++it2)
          if (*it == *it2)
          {
            omerr() << "ImporterT: Face has equal vertices\n";
            failed_faces_.push_back(_indices);
            return fh;
          }


      // try to add face
      fh = mesh_.add_face(_indices);
      if (!fh.is_valid())
      {
        failed_faces_.push_back(_indices);
        return fh;
      }

      //write the half edge normals
      if (mesh_.has_halfedge_normals())
      {
        //iterate over all incoming haldedges of the added face
        for (typename Mesh::FaceHalfedgeIter fh_iter = mesh_.fh_begin(fh);
            fh_iter != mesh_.fh_end(fh); ++fh_iter)
        {
          //and write the normals to it
          typename Mesh::HalfedgeHandle heh = *fh_iter;
          typename Mesh::VertexHandle vh = mesh_.to_vertex_handle(heh);
          typename std::map<VertexHandle,Normal>::iterator it_heNs = halfedgeNormals_.find(vh);
          if (it_heNs != halfedgeNormals_.end())
            mesh_.set_normal(heh,it_heNs->second);
        }
        halfedgeNormals_.clear();
      }
    }
    return fh;
  }